

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

uint32 __thiscall Clasp::Asp::PrgBody::findLit(PrgBody *this,LogicProgram *prg,Literal p)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0;
  for (uVar3 = (ulong)((*(uint *)&this->field_0x8 & 0x1ffffff) << 2); uVar3 != 0; uVar3 = uVar3 - 4)
  {
    uVar1 = *(uint *)(&(&this[1].super_PrgNode)[(*(uint *)&this->field_0x8 & 0x18000000) != 0].
                       field_0x0 + lVar2 * 4);
    if ((uVar1 & 2 ^ p.rep_ ^
        *(int *)&((prg->atoms_).ebo_.buf[uVar1 >> 2]->super_PrgHead).super_PrgNode * 2) < 2)
    goto LAB_00147296;
    lVar2 = lVar2 + 1;
  }
  lVar2 = 0x40000000;
LAB_00147296:
  return (uint32)lVar2;
}

Assistant:

uint32 PrgBody::findLit(const LogicProgram& prg, Literal p) const {
	for (const Literal* it = goals_begin(), *end = it + size(); it != end; ++it) {
		Literal x = prg.getAtom(it->var())->literal();
		if (it->sign()) x = ~x;
		if (x == p) return static_cast<uint32>(it - goals_begin());
	}
	return varMax;
}